

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleInt32::read
          (PLYValueLittleInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = std::streambuf::sbumpc();
  this->value = uVar1 & 0xff;
  uVar1 = std::streambuf::sbumpc();
  this->value = this->value | (uVar1 & 0xff) << 8;
  uVar1 = std::streambuf::sbumpc();
  this->value = this->value | (uVar1 & 0xff) << 0x10;
  iVar2 = std::streambuf::sbumpc();
  this->value = this->value | iVar2 << 0x18;
  return (ulong)(uint)(iVar2 << 0x18);
}

Assistant:

void read(std::streambuf *in)
    {
      value=in->sbumpc()&0xff;
      value|=(in->sbumpc()&0xff)<<8;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<24;
    }